

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

char * convert_charset(char *in_str,Charset from,Charset to)

{
  long lVar1;
  iconv_t __cd;
  size_t sVar2;
  char *pcVar3;
  char *__tocode;
  size_t sVar4;
  size_t n_out;
  size_t n_in;
  char *out;
  char *in;
  size_t local_50;
  size_t local_48;
  char *local_40;
  char *local_38;
  
  __tocode = "";
  pcVar3 = "";
  if (from < (CS_UTF_16LE|CS_UTF_8)) {
    pcVar3 = (&PTR_anon_var_dwarf_35d_0019b360)[from];
  }
  if (to < (CS_UTF_16LE|CS_UTF_8)) {
    __tocode = (&PTR_anon_var_dwarf_35d_0019b360)[to];
  }
  __cd = iconv_open(__tocode,pcVar3);
  if (__cd != (iconv_t)0xffffffffffffffff) {
    if (from == CS_UTF_16LE) {
      if (*(short *)in_str == 0) {
        local_48 = 0;
      }
      else {
        sVar2 = 0;
        do {
          local_48 = sVar2 + 2;
          lVar1 = sVar2 + 2;
          sVar2 = local_48;
        } while (*(short *)(in_str + lVar1) != 0);
      }
    }
    else {
      local_48 = strlen(in_str);
    }
    sVar4 = local_48 * 6 << (to == CS_UTF_16LE);
    local_50 = sVar4;
    local_38 = in_str;
    pcVar3 = (char *)malloc((to == CS_UTF_16LE) + sVar4 + 1);
    local_40 = pcVar3;
    sVar2 = iconv(__cd,&local_38,&local_48,&local_40,&local_50);
    if (sVar2 != 0xffffffffffffffff) {
      pcVar3[sVar4 - local_50] = '\0';
      if (to != CS_UTF_16LE) {
        return pcVar3;
      }
      pcVar3[(sVar4 - local_50) + 1] = '\0';
      return pcVar3;
    }
  }
  g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
  return (char *)0x0;
}

Assistant:

char *convert_charset(const char *in_str, Charset from, Charset to)
{
	char *cs_from = charset_string(from);
	char *cs_to = charset_string(to);
	iconv_t conv = iconv_open(cs_to, cs_from);
	if (conv == (iconv_t)-1)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	size_t n_in = (from == CS_UTF_16LE) ? strlenU16((char16_t *)in_str) * sizeof(char16_t) : strlen(in_str) * sizeof(char);
	size_t length = n_in * 6;
	size_t type_size = (to == CS_UTF_16LE) ? sizeof(char16_t) : sizeof(char);
	length *= type_size;
	size_t n_out = length;
	char *in = (char *)in_str;
	char *str_out = (char *)malloc(length + type_size);
	char *out = (char *)str_out;
	if (iconv(conv, (char **)&in, &n_in, &out, &n_out) == (size_t)-1)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	str_out[length - n_out] = 0;
	if (type_size == sizeof(char16_t))
	{
		str_out[length - n_out + 1] = 0;
	}
	return str_out;
}